

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *pcVar1;
  ulong uVar2;
  string *in_RDI;
  char *colon;
  char *gtest_output_flag;
  allocator local_2d [19];
  byte local_1a;
  allocator local_19;
  char *local_18;
  char *local_10;
  
  local_10 = (char *)std::__cxx11::string::c_str();
  local_18 = strchr(local_10,0x3a);
  pcVar1 = local_10;
  local_1a = 0;
  if (local_18 == (char *)0x0) {
    std::allocator<char>::allocator();
    local_1a = 1;
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_19);
  }
  else {
    uVar2 = (long)local_18 - (long)local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  if ((local_1a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == nullptr)
             ? std::string(gtest_output_flag)
             : std::string(gtest_output_flag, colon - gtest_output_flag);
}